

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

int32_t __thiscall icu_63::RuleBasedBreakIterator::handleNext(RuleBasedBreakIterator *this)

{
  UText *ut;
  UChar UVar1;
  uint uVar2;
  uint uVar3;
  RBBIStateTable *pRVar4;
  UTrie2 *pUVar5;
  uint16_t *puVar6;
  uint uVar7;
  short sVar8;
  uint uVar9;
  ulong uVar10;
  int64_t iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  uint uVar17;
  ushort uVar18;
  uint uVar19;
  long index;
  uint uVar20;
  bool bVar21;
  uint local_dc;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  pRVar4 = this->fData->fForwardTable;
  uVar2 = pRVar4->fRowLen;
  uVar14 = (ulong)uVar2;
  this->fRuleStatusIndex = 0;
  this->fDictionaryCharCount = 0;
  uVar3 = this->fPosition;
  index = (long)(int)uVar3;
  ut = &this->fText;
  uVar10 = index - (this->fText).chunkNativeStart;
  if ((((long)uVar10 < 0) || ((long)(this->fText).nativeIndexingLimit <= (long)uVar10)) ||
     (0xdbff < (ushort)(this->fText).chunkContents[uVar10])) {
    utext_setNativeIndex_63(ut,index);
    uVar10 = (ulong)(uint)(this->fText).chunkOffset;
  }
  else {
    (this->fText).chunkOffset = (int32_t)uVar10;
  }
  iVar13 = (int)uVar10;
  if ((iVar13 < (this->fText).chunkLength) &&
     (UVar1 = (this->fText).chunkContents[iVar13], uVar17 = (uint)(ushort)UVar1,
     (ushort)UVar1 < 0xd800)) {
    (this->fText).chunkOffset = iVar13 + 1;
  }
  else {
    uVar17 = utext_next32_63(ut);
    if (uVar17 == 0xffffffff) {
      this->fDone = '\x01';
      return -1;
    }
  }
  local_dc = pRVar4->fFlags & 2;
  uVar19 = local_dc >> 1 ^ 1;
  uVar20 = 0;
  uVar10 = (ulong)uVar3;
LAB_0029cb82:
  uVar12 = uVar17 >> 5;
  uVar7 = uVar12 + 0x140;
  if (0xdbff < uVar17) {
    uVar7 = uVar12;
  }
  do {
    uVar9 = (uint)uVar10;
    if (uVar17 == 0xffffffff) {
      if (uVar19 == 2) goto LAB_0029ce9f;
      uVar18 = *(ushort *)(pRVar4[1].fTableData + (uVar14 - 10));
      uVar14 = (ulong)(uVar18 * uVar2);
      pcVar16 = pRVar4->fTableData + uVar14;
      sVar8 = *(short *)(pRVar4->fTableData + uVar14);
      local_dc = 1;
      uVar19 = 2;
      bVar21 = false;
      if (sVar8 == -1) goto LAB_0029cca3;
    }
    else {
      bVar21 = uVar19 == 1;
      if (bVar21) {
        pUVar5 = this->fData->fTrie;
        puVar6 = pUVar5->index;
        uVar15 = (ulong)uVar12;
        if ((uVar17 < 0xd800) || (uVar15 = (ulong)uVar7, uVar17 < 0x10000)) {
LAB_0029cc49:
          iVar13 = (uVar17 & 0x1f) + (uint)puVar6[uVar15] * 4;
        }
        else if (uVar17 < 0x110000) {
          if ((int)uVar17 < pUVar5->highStart) {
            uVar15 = (ulong)((uint)puVar6[(ulong)(uVar17 >> 0xb) + 0x820] + (uVar12 & 0x3f));
            goto LAB_0029cc49;
          }
          iVar13 = pUVar5->highValueIndex;
        }
        else {
          iVar13 = pUVar5->indexLength + 0x80;
        }
        local_dc = (uint)puVar6[iVar13];
        if ((puVar6[iVar13] >> 0xe & 1) != 0) {
          this->fDictionaryCharCount = this->fDictionaryCharCount + 1;
          local_dc = local_dc & 0xbfff;
        }
      }
      uVar18 = *(ushort *)(pRVar4[1].fTableData + (ulong)(ushort)local_dc * 2 + uVar14 + -0xc);
      uVar14 = (ulong)(uVar18 * uVar2);
      pcVar16 = pRVar4->fTableData + uVar14;
      sVar8 = *(short *)(pRVar4->fTableData + uVar14);
      if (sVar8 == -1) {
        if (uVar19 == 0) {
          uVar19 = 0;
LAB_0029ccf5:
          sVar8 = -1;
        }
        else {
LAB_0029cca3:
          uVar9 = (this->fText).chunkOffset;
          if ((int)uVar9 <= (this->fText).nativeIndexingLimit) {
            uVar10 = (ulong)uVar9 + (this->fText).chunkNativeStart;
            goto LAB_0029ccf5;
          }
          uVar10 = (*((this->fText).pFuncs)->mapOffsetToNative)(ut);
          sVar8 = *(short *)pcVar16;
        }
        this->fRuleStatusIndex = (int)*(short *)(pcVar16 + 4);
      }
    }
    uVar9 = (uint)uVar10;
    if ((0 < sVar8) && (0 < (int)uVar20)) {
      uVar15 = 0;
      do {
        if (*(short *)((long)&local_48 + uVar15 * 2 + 4) == sVar8) {
          iVar13 = *(int *)((long)&local_68 + uVar15 * 4 + 4);
          if (-1 < iVar13) {
            this->fRuleStatusIndex = (int)*(short *)(pcVar16 + 4);
            this->fPosition = iVar13;
            return iVar13;
          }
          break;
        }
        uVar15 = uVar15 + 1;
      } while (uVar20 != uVar15);
    }
    sVar8 = *(short *)(pcVar16 + 2);
    if (sVar8 != 0) {
      iVar13 = (this->fText).chunkOffset;
      if ((this->fText).nativeIndexingLimit < iVar13) {
        iVar11 = (*((this->fText).pFuncs)->mapOffsetToNative)(ut);
        iVar13 = (int)iVar11;
      }
      else {
        iVar13 = iVar13 + (int)(this->fText).chunkNativeStart;
      }
      if ((int)uVar20 < 1) {
        uVar20 = 0;
      }
      else {
        uVar15 = 0;
        do {
          if (*(short *)((long)&local_48 + uVar15 * 2 + 4) == sVar8) {
            *(int *)((long)&local_68 + uVar15 * 4 + 4) = iVar13;
            goto LAB_0029cdeb;
          }
          uVar15 = uVar15 + 1;
        } while (uVar20 != uVar15);
      }
      uVar15 = (ulong)uVar20;
      if (6 < uVar20) {
        uVar15 = 7;
      }
      *(short *)((long)&local_48 + uVar15 * 2 + 4) = sVar8;
      *(int *)((long)&local_68 + uVar15 * 4 + 4) = iVar13;
      uVar20 = (int)uVar15 + 1;
    }
LAB_0029cdeb:
    if (uVar18 == 0) {
LAB_0029ce9f:
      if (uVar9 == uVar3) {
        utext_setNativeIndex_63(ut,index);
        utext_next32_63(ut);
        iVar11 = utext_getNativeIndex_63(ut);
        uVar9 = (uint)iVar11;
        this->fRuleStatusIndex = 0;
      }
      this->fPosition = uVar9;
      return uVar9;
    }
    if (bVar21) break;
    uVar19 = uVar19 + (uVar19 == 0);
  } while( true );
  iVar13 = (this->fText).chunkOffset;
  if ((iVar13 < (this->fText).chunkLength) &&
     (uVar17 = (uint)(ushort)(this->fText).chunkContents[iVar13], uVar17 < 0xd800)) {
    (this->fText).chunkOffset = iVar13 + 1;
    uVar19 = 1;
  }
  else {
    uVar17 = utext_next32_63(ut);
    uVar19 = 1;
  }
  goto LAB_0029cb82;
}

Assistant:

int32_t RuleBasedBreakIterator::handleNext() {
    int32_t             state;
    uint16_t            category        = 0;
    RBBIRunMode         mode;

    RBBIStateTableRow  *row;
    UChar32             c;
    LookAheadResults    lookAheadMatches;
    int32_t             result             = 0;
    int32_t             initialPosition    = 0;
    const RBBIStateTable *statetable       = fData->fForwardTable;
    const char         *tableData          = statetable->fTableData;
    uint32_t            tableRowLen        = statetable->fRowLen;
    #ifdef RBBI_DEBUG
        if (gTrace) {
            RBBIDebugPuts("Handle Next   pos   char  state category");
        }
    #endif

    // handleNext alway sets the break tag value.
    // Set the default for it.
    fRuleStatusIndex = 0;

    fDictionaryCharCount = 0;

    // if we're already at the end of the text, return DONE.
    initialPosition = fPosition;
    UTEXT_SETNATIVEINDEX(&fText, initialPosition);
    result          = initialPosition;
    c               = UTEXT_NEXT32(&fText);
    if (c==U_SENTINEL) {
        fDone = TRUE;
        return UBRK_DONE;
    }

    //  Set the initial state for the state machine
    state = START_STATE;
    row = (RBBIStateTableRow *)
            //(statetable->fTableData + (statetable->fRowLen * state));
            (tableData + tableRowLen * state);


    mode     = RBBI_RUN;
    if (statetable->fFlags & RBBI_BOF_REQUIRED) {
        category = 2;
        mode     = RBBI_START;
    }


    // loop until we reach the end of the text or transition to state 0
    //
    for (;;) {
        if (c == U_SENTINEL) {
            // Reached end of input string.
            if (mode == RBBI_END) {
                // We have already run the loop one last time with the
                //   character set to the psueudo {eof} value.  Now it is time
                //   to unconditionally bail out.
                break;
            }
            // Run the loop one last time with the fake end-of-input character category.
            mode = RBBI_END;
            category = 1;
        }

        //
        // Get the char category.  An incoming category of 1 or 2 means that
        //      we are preset for doing the beginning or end of input, and
        //      that we shouldn't get a category from an actual text input character.
        //
        if (mode == RBBI_RUN) {
            // look up the current character's character category, which tells us
            // which column in the state table to look at.
            // Note:  the 16 in UTRIE_GET16 refers to the size of the data being returned,
            //        not the size of the character going in, which is a UChar32.
            //
            category = UTRIE2_GET16(fData->fTrie, c);

            // Check the dictionary bit in the character's category.
            //    Counter is only used by dictionary based iteration.
            //    Chars that need to be handled by a dictionary have a flag bit set
            //    in their category values.
            //
            if ((category & 0x4000) != 0)  {
                fDictionaryCharCount++;
                //  And off the dictionary flag bit.
                category &= ~0x4000;
            }
        }

       #ifdef RBBI_DEBUG
            if (gTrace) {
                RBBIDebugPrintf("             %4" PRId64 "   ", utext_getNativeIndex(&fText));
                if (0x20<=c && c<0x7f) {
                    RBBIDebugPrintf("\"%c\"  ", c);
                } else {
                    RBBIDebugPrintf("%5x  ", c);
                }
                RBBIDebugPrintf("%3d  %3d\n", state, category);
            }
        #endif

        // State Transition - move machine to its next state
        //

        // fNextState is a variable-length array.
        U_ASSERT(category<fData->fHeader->fCatCount);
        state = row->fNextState[category];  /*Not accessing beyond memory*/
        row = (RBBIStateTableRow *)
            // (statetable->fTableData + (statetable->fRowLen * state));
            (tableData + tableRowLen * state);


        if (row->fAccepting == -1) {
            // Match found, common case.
            if (mode != RBBI_START) {
                result = (int32_t)UTEXT_GETNATIVEINDEX(&fText);
            }
            fRuleStatusIndex = row->fTagIdx;   // Remember the break status (tag) values.
        }

        int16_t completedRule = row->fAccepting;
        if (completedRule > 0) {
            // Lookahead match is completed.
            int32_t lookaheadResult = lookAheadMatches.getPosition(completedRule);
            if (lookaheadResult >= 0) {
                fRuleStatusIndex = row->fTagIdx;
                fPosition = lookaheadResult;
                return lookaheadResult;
            }
        }
        int16_t rule = row->fLookAhead;
        if (rule != 0) {
            // At the position of a '/' in a look-ahead match. Record it.
            int32_t  pos = (int32_t)UTEXT_GETNATIVEINDEX(&fText);
            lookAheadMatches.setPosition(rule, pos);
        }

        if (state == STOP_STATE) {
            // This is the normal exit from the lookup state machine.
            // We have advanced through the string until it is certain that no
            //   longer match is possible, no matter what characters follow.
            break;
        }

        // Advance to the next character.
        // If this is a beginning-of-input loop iteration, don't advance
        //    the input position.  The next iteration will be processing the
        //    first real input character.
        if (mode == RBBI_RUN) {
            c = UTEXT_NEXT32(&fText);
        } else {
            if (mode == RBBI_START) {
                mode = RBBI_RUN;
            }
        }
    }

    // The state machine is done.  Check whether it found a match...

    // If the iterator failed to advance in the match engine, force it ahead by one.
    //   (This really indicates a defect in the break rules.  They should always match
    //    at least one character.)
    if (result == initialPosition) {
        utext_setNativeIndex(&fText, initialPosition);
        utext_next32(&fText);
        result = (int32_t)utext_getNativeIndex(&fText);
        fRuleStatusIndex = 0;
    }

    // Leave the iterator at our result position.
    fPosition = result;
    #ifdef RBBI_DEBUG
        if (gTrace) {
            RBBIDebugPrintf("result = %d\n\n", result);
        }
    #endif
    return result;
}